

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O0

DWORD __thiscall
FNodeBuilder::AddMiniseg(FNodeBuilder *this,int v1,int v2,DWORD partner,DWORD seg1,DWORD splitseg)

{
  uint uVar1;
  FPrivSeg *pFVar2;
  FPrivVert *pFVar3;
  undefined1 local_78 [8];
  FPrivSeg newseg;
  FPrivSeg *seg;
  DWORD nseg;
  DWORD splitseg_local;
  DWORD seg1_local;
  DWORD partner_local;
  int v2_local;
  int v1_local;
  FNodeBuilder *this_local;
  
  newseg.hashnext =
       TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[](&this->Segs,(ulong)seg1);
  newseg.v1 = -1;
  newseg.v2 = -1;
  newseg.nextforvert = 0;
  newseg.backsector._0_4_ = 0xffffffff;
  newseg.storedseg._0_1_ = 1;
  newseg.planenum = 0;
  newseg.planefront = false;
  newseg._61_3_ = 0;
  newseg.loopnum = -1;
  newseg.sidedef = 0;
  newseg.linedef = 0;
  newseg.frontsector = (sector_t_conflict *)0x0;
  if (splitseg == 0xffffffff) {
    newseg.partner = 0xffffffff;
  }
  else {
    pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)splitseg);
    newseg.partner = pFVar2->planenum;
  }
  local_78._0_4_ = v1;
  local_78._4_4_ = v2;
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)v1);
  newseg.backsector._4_4_ = pFVar3->segs;
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)v2);
  newseg.next = pFVar3->segs2;
  newseg.backsector._0_4_ = (newseg.hashnext)->next;
  newseg.nextforvert2 = partner;
  if (partner == 0xffffffff) {
    newseg.nextforvert2 = 0xffffffff;
  }
  uVar1 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push
                    (&this->Segs,(FPrivSeg *)local_78);
  if (newseg.nextforvert2 != 0xffffffff) {
    pFVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(ulong)partner);
    pFVar2->partner = uVar1;
  }
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)v1);
  pFVar3->segs = uVar1;
  pFVar3 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)v2);
  pFVar3->segs2 = uVar1;
  return uVar1;
}

Assistant:

DWORD FNodeBuilder::AddMiniseg (int v1, int v2, DWORD partner, DWORD seg1, DWORD splitseg)
{
	DWORD nseg;
	FPrivSeg *seg = &Segs[seg1];
	FPrivSeg newseg;

	newseg.sidedef = NO_SIDE;
	newseg.linedef = -1;
	newseg.loopnum = 0;
	newseg.next = DWORD_MAX;
	newseg.planefront = true;
	newseg.hashnext = NULL;
	newseg.storedseg = DWORD_MAX;
	newseg.frontsector = NULL;
	newseg.backsector = NULL;

	if (splitseg != DWORD_MAX)
	{
		newseg.planenum = Segs[splitseg].planenum;
	}
	else
	{
		newseg.planenum = -1;
	}

	newseg.v1 = v1;
	newseg.v2 = v2;
	newseg.nextforvert = Vertices[v1].segs;
	newseg.nextforvert2 = Vertices[v2].segs2;
	newseg.next = seg->next;
	if (partner != DWORD_MAX)
	{
		newseg.partner = partner;
	}
	else
	{
		newseg.partner = DWORD_MAX;
	}
	nseg = Segs.Push (newseg);
	if (newseg.partner != DWORD_MAX)
	{
		Segs[partner].partner = nseg;
	}
	Vertices[v1].segs = nseg;
	Vertices[v2].segs2 = nseg;
	//Printf ("Between %d and %d::::\n", seg1, seg2);
	return nseg;
}